

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O0

void tcu::fillWithGrid3D(PixelBufferAccess *access,int cellSize,Vec4 *colorA,Vec4 *colorB)

{
  int iVar1;
  int mz;
  int my;
  int mx;
  int x;
  int y;
  int z;
  Vec4 *colorB_local;
  Vec4 *colorA_local;
  int cellSize_local;
  PixelBufferAccess *access_local;
  
  x = 0;
  while( true ) {
    iVar1 = ConstPixelBufferAccess::getDepth(&access->super_ConstPixelBufferAccess);
    if (iVar1 <= x) break;
    mx = 0;
    while( true ) {
      iVar1 = ConstPixelBufferAccess::getHeight(&access->super_ConstPixelBufferAccess);
      if (iVar1 <= mx) break;
      my = 0;
      while( true ) {
        iVar1 = ConstPixelBufferAccess::getWidth(&access->super_ConstPixelBufferAccess);
        if (iVar1 <= my) break;
        if (((uint)((long)((ulong)(uint)((int)((long)my / (long)cellSize) >> 0x1f) << 0x20 |
                          (long)my / (long)cellSize & 0xffffffffU) % 2) ^
            (uint)((long)((ulong)(uint)((int)((long)mx / (long)cellSize) >> 0x1f) << 0x20 |
                         (long)mx / (long)cellSize & 0xffffffffU) % 2)) ==
            (uint)((long)((ulong)(uint)((int)((long)x / (long)cellSize) >> 0x1f) << 0x20 |
                         (long)x / (long)cellSize & 0xffffffffU) % 2)) {
          PixelBufferAccess::setPixel(access,colorA,my,mx,x);
        }
        else {
          PixelBufferAccess::setPixel(access,colorB,my,mx,x);
        }
        my = my + 1;
      }
      mx = mx + 1;
    }
    x = x + 1;
  }
  return;
}

Assistant:

static void fillWithGrid3D (const PixelBufferAccess& access, int cellSize, const Vec4& colorA, const Vec4& colorB)
{
	for (int z = 0; z < access.getDepth(); z++)
	{
		for (int y = 0; y < access.getHeight(); y++)
		{
			for (int x = 0; x < access.getWidth(); x++)
			{
				int mx = (x / cellSize) % 2;
				int my = (y / cellSize) % 2;
				int mz = (z / cellSize) % 2;

				if (mx ^ my ^ mz)
					access.setPixel(colorB, x, y, z);
				else
					access.setPixel(colorA, x, y, z);
			}
		}
	}
}